

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

void Extra_BitMatrixShow(Vec_Wrd_t *vSims,int nWords)

{
  FILE *pFile;
  int iVar1;
  word *Sign;
  int local_1c;
  int nBits;
  int k;
  int i;
  int nWords_local;
  Vec_Wrd_t *vSims_local;
  
  iVar1 = Vec_WrdSize(vSims);
  for (nBits = 0; nBits < iVar1 / nWords; nBits = nBits + 1) {
    if (nBits % 0x40 == 0) {
      Abc_Print(1,"\n");
    }
    for (local_1c = 0; pFile = _stdout, local_1c < nWords; local_1c = local_1c + 1) {
      Sign = Vec_WrdEntryP(vSims,nBits * nWords + local_1c);
      Extra_PrintBinary2(pFile,(uint *)Sign,0x40);
      Abc_Print(1," ");
    }
    Abc_Print(1,"\n");
  }
  Abc_Print(1,"\n");
  return;
}

Assistant:

void Extra_BitMatrixShow( Vec_Wrd_t * vSims, int nWords )
{
    int i, k, nBits = Vec_WrdSize(vSims)  / nWords;
    for ( i = 0; i < nBits; i++ )
    {
        if ( i%64 == 0 )
            Abc_Print( 1, "\n" );
        for ( k = 0; k < nWords; k++ )
        {
            Extra_PrintBinary2( stdout, (unsigned *)Vec_WrdEntryP(vSims, i*nWords+k), 64 );
            Abc_Print( 1, " " );
        }
        Abc_Print( 1, "\n" );
    }
    Abc_Print( 1, "\n" );
}